

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void sendsuboption(Curl_easy *data,int option)

{
  uchar **ppuVar1;
  uchar *buffer;
  unsigned_short uVar2;
  unsigned_short uVar3;
  connectdata *pcVar4;
  TELNET *pTVar5;
  uchar *puVar6;
  uchar *puVar7;
  ssize_t sVar8;
  uint *puVar9;
  
  if (option == 0x1f) {
    pcVar4 = data->conn;
    pTVar5 = (data->req).p.telnet;
    ppuVar1 = &pTVar5->subpointer;
    pTVar5->subbuffer[0] = 0xff;
    pTVar5->subbuffer[1] = 0xfa;
    buffer = pTVar5->subbuffer + 3;
    pTVar5->subpointer = buffer;
    pTVar5->subbuffer[2] = '\x1f';
    uVar2 = pTVar5->subopt_wsx;
    uVar3 = pTVar5->subopt_wsy;
    if (buffer < ppuVar1) {
      *ppuVar1 = pTVar5->subbuffer + 4;
      *buffer = (uchar)(uVar2 >> 8);
    }
    puVar6 = *ppuVar1;
    if (puVar6 < ppuVar1) {
      *ppuVar1 = puVar6 + 1;
      *puVar6 = (uchar)uVar2;
    }
    puVar6 = *ppuVar1;
    if (puVar6 < ppuVar1) {
      *ppuVar1 = puVar6 + 1;
      *puVar6 = (uchar)(uVar3 >> 8);
    }
    puVar6 = *ppuVar1;
    if (puVar6 < ppuVar1) {
      *ppuVar1 = puVar6 + 1;
      *puVar6 = (uchar)uVar3;
    }
    puVar6 = *ppuVar1;
    if (puVar6 < ppuVar1) {
      *ppuVar1 = puVar6 + 1;
      *puVar6 = 0xff;
    }
    puVar6 = pTVar5->subbuffer;
    puVar7 = *ppuVar1;
    if (puVar7 < ppuVar1) {
      *ppuVar1 = puVar7 + 1;
      *puVar7 = 0xf0;
    }
    puVar7 = pTVar5->subpointer;
    pTVar5->subend = puVar7;
    pTVar5->subpointer = puVar6;
    printsub(data,0x3e,pTVar5->subbuffer + 2,(size_t)(puVar7 + (-2 - (long)puVar6)));
    sVar8 = send(pcVar4->sock[0],puVar6,3,0x4000);
    if (sVar8 < 0) {
      puVar9 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar9);
    }
    send_telnet_data(data,(char *)buffer,4);
    sVar8 = send(pcVar4->sock[0],pTVar5->subbuffer + 7,2,0x4000);
    if (sVar8 < 0) {
      puVar9 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar9);
      return;
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct Curl_easy *data, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char *uc1, *uc2;
  struct TELNET *tn = data->req.p.telnet;
  struct connectdata *conn = data->conn;

  switch(option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with little or big endian processors */
    /* Window size must be sent according to the 'network order' */
    x = htons(tn->subopt_wsx);
    y = htons(tn->subopt_wsy);
    uc1 = (unsigned char *)&x;
    uc2 = (unsigned char *)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer + 2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(data, (char *)tn->subbuffer + 3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer + 7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}